

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluShaderProgram.cpp
# Opt level: O3

TestLog * glu::operator<<(TestLog *log,ShaderProgramInfo *shaderProgramInfo)

{
  long lVar1;
  ShaderInfo **shaderInfos;
  size_t numShaders;
  ulong uVar2;
  vector<const_glu::ShaderInfo_*,_std::allocator<const_glu::ShaderInfo_*>_> shaderPtrs;
  allocator_type local_31;
  vector<const_glu::ShaderInfo_*,_std::allocator<const_glu::ShaderInfo_*>_> local_30;
  
  std::vector<const_glu::ShaderInfo_*,_std::allocator<const_glu::ShaderInfo_*>_>::vector
            (&local_30,
             ((long)(shaderProgramInfo->shaders).
                    super__Vector_base<glu::ShaderInfo,_std::allocator<glu::ShaderInfo>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)(shaderProgramInfo->shaders).
                    super__Vector_base<glu::ShaderInfo,_std::allocator<glu::ShaderInfo>_>._M_impl.
                    super__Vector_impl_data._M_start >> 3) * 0x2e8ba2e8ba2e8ba3,&local_31);
  if (local_30.super__Vector_base<const_glu::ShaderInfo_*,_std::allocator<const_glu::ShaderInfo_*>_>
      ._M_impl.super__Vector_impl_data._M_finish ==
      local_30.super__Vector_base<const_glu::ShaderInfo_*,_std::allocator<const_glu::ShaderInfo_*>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    numShaders = 0;
  }
  else {
    lVar1 = 0;
    uVar2 = 0;
    do {
      local_30.super__Vector_base<const_glu::ShaderInfo_*,_std::allocator<const_glu::ShaderInfo_*>_>
      ._M_impl.super__Vector_impl_data._M_start[uVar2] =
           (ShaderInfo *)
           ((long)&((shaderProgramInfo->shaders).
                    super__Vector_base<glu::ShaderInfo,_std::allocator<glu::ShaderInfo>_>._M_impl.
                    super__Vector_impl_data._M_start)->type + lVar1);
      uVar2 = uVar2 + 1;
      numShaders = (long)local_30.
                         super__Vector_base<const_glu::ShaderInfo_*,_std::allocator<const_glu::ShaderInfo_*>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)local_30.
                         super__Vector_base<const_glu::ShaderInfo_*,_std::allocator<const_glu::ShaderInfo_*>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 3;
      lVar1 = lVar1 + 0x58;
    } while (uVar2 < numShaders);
  }
  shaderInfos = (ShaderInfo **)0x0;
  if (local_30.super__Vector_base<const_glu::ShaderInfo_*,_std::allocator<const_glu::ShaderInfo_*>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_30.super__Vector_base<const_glu::ShaderInfo_*,_std::allocator<const_glu::ShaderInfo_*>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    shaderInfos = local_30.
                  super__Vector_base<const_glu::ShaderInfo_*,_std::allocator<const_glu::ShaderInfo_*>_>
                  ._M_impl.super__Vector_impl_data._M_start;
  }
  logShaderProgram(log,&shaderProgramInfo->program,numShaders,shaderInfos);
  if (local_30.super__Vector_base<const_glu::ShaderInfo_*,_std::allocator<const_glu::ShaderInfo_*>_>
      ._M_impl.super__Vector_impl_data._M_start != (ShaderInfo **)0x0) {
    operator_delete(local_30.
                    super__Vector_base<const_glu::ShaderInfo_*,_std::allocator<const_glu::ShaderInfo_*>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_30.
                          super__Vector_base<const_glu::ShaderInfo_*,_std::allocator<const_glu::ShaderInfo_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_30.
                          super__Vector_base<const_glu::ShaderInfo_*,_std::allocator<const_glu::ShaderInfo_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return log;
}

Assistant:

tcu::TestLog& operator<< (tcu::TestLog& log, const ShaderProgramInfo& shaderProgramInfo)
{
	std::vector<const ShaderInfo*>	shaderPtrs	(shaderProgramInfo.shaders.size());

	for (size_t ndx = 0; ndx < shaderPtrs.size(); ndx++)
		shaderPtrs[ndx] = &shaderProgramInfo.shaders[ndx];

	logShaderProgram(log, shaderProgramInfo.program, shaderPtrs.size(), shaderPtrs.empty() ? DE_NULL : &shaderPtrs[0]);

	return log;
}